

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::GLES2ThreadTest::CreateImageFromTexture::CreateImageFromTexture
          (CreateImageFromTexture *this,SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *image,
          SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *texture,bool useSync,bool serverSync)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  Texture *pTVar3;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *pSVar4;
  EGLImage *this_00;
  SharedPtrStateBase *pSVar5;
  deInt32 *pdVar6;
  SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> local_68;
  SharedPtr<tcu::ThreadUtil::Event> local_58;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_48;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *local_38;
  
  Operation::Operation(&this->super_Operation,"CreateImageFromTexture",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__CreateImageFromTexture_0215f1e8;
  (this->m_texture).m_ptr = (Texture *)0x0;
  (this->m_texture).m_state = (SharedPtrStateBase *)0x0;
  (this->m_image).m_ptr = (EGLImage *)0x0;
  (this->m_image).m_state = (SharedPtrStateBase *)0x0;
  local_48.m_ptr = &texture->m_ptr->super_Object;
  local_48.m_state = texture->m_state;
  if (local_48.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_48.m_state)->strongRefCount = (local_48.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_48.m_state)->weakRefCount = (local_48.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Operation::modifyGLObject(&this->super_Operation,&local_48);
  if (local_48.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_48.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_48.m_ptr = (Object *)0x0;
      (*(local_48.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_48.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_48.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_48.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_48.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  this_00 = (EGLImage *)operator_new(0x68);
  local_58.m_ptr = (this->super_Operation).super_Operation.m_event.m_ptr;
  local_58.m_state = (this->super_Operation).super_Operation.m_event.m_state;
  if (local_58.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_58.m_state)->strongRefCount = (local_58.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_58.m_state)->weakRefCount = (local_58.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  local_68.m_ptr = (this->super_Operation).m_sync.m_ptr;
  local_68.m_state = (this->super_Operation).m_sync.m_state;
  if (local_68.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_68.m_state)->strongRefCount = (local_68.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_68.m_state)->weakRefCount = (local_68.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  EGLImage::EGLImage(this_00,&local_58,&local_68);
  local_38 = texture;
  pSVar5 = (SharedPtrStateBase *)operator_new(0x20);
  pdVar1 = &pSVar5->strongRefCount;
  pSVar5->strongRefCount = 0;
  pSVar5->weakRefCount = 0;
  pSVar5->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0215fa08;
  pSVar5[1]._vptr_SharedPtrStateBase = (_func_int **)this_00;
  pSVar5->strongRefCount = 1;
  pSVar5->weakRefCount = 1;
  pSVar2 = image->m_state;
  if (pSVar2 != pSVar5) {
    if (pSVar2 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar6 = &pSVar2->strongRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        image->m_ptr = (EGLImage *)0x0;
        (*image->m_state->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar6 = &image->m_state->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        if (image->m_state != (SharedPtrStateBase *)0x0) {
          (*image->m_state->_vptr_SharedPtrStateBase[1])();
        }
        image->m_state = (SharedPtrStateBase *)0x0;
      }
    }
    image->m_ptr = this_00;
    image->m_state = pSVar5;
    LOCK();
    pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &image->m_state->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
  }
  pdVar6 = &pSVar5->weakRefCount;
  LOCK();
  *pdVar1 = *pdVar1 + -1;
  UNLOCK();
  if (*pdVar1 == 0) {
    (*pSVar5->_vptr_SharedPtrStateBase[2])(pSVar5);
  }
  pSVar4 = local_38;
  LOCK();
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if (*pdVar6 == 0) {
    (*pSVar5->_vptr_SharedPtrStateBase[1])(pSVar5);
  }
  if (local_68.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_68.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_68.m_ptr = (FenceSync *)0x0;
      (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_68.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_68.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_68.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (local_58.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_58.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_58.m_ptr = (Event *)0x0;
      (*(local_58.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_58.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_58.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_58.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_58.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  pSVar2 = (this->m_image).m_state;
  if (pSVar2 != image->m_state) {
    if (pSVar2 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar2->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (this->m_image).m_ptr = (EGLImage *)0x0;
        (*((this->m_image).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((this->m_image).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar2 = (this->m_image).m_state;
        if (pSVar2 != (SharedPtrStateBase *)0x0) {
          (*pSVar2->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_image).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_image).m_ptr = image->m_ptr;
    pSVar2 = image->m_state;
    (this->m_image).m_state = pSVar2;
    if (pSVar2 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((this->m_image).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
  }
  pSVar2 = (this->m_texture).m_state;
  if (pSVar2 != pSVar4->m_state) {
    if (pSVar2 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar2->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (this->m_texture).m_ptr = (Texture *)0x0;
        (*((this->m_texture).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((this->m_texture).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar2 = (this->m_texture).m_state;
        if (pSVar2 != (SharedPtrStateBase *)0x0) {
          (*pSVar2->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_texture).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_texture).m_ptr = pSVar4->m_ptr;
    pSVar2 = pSVar4->m_state;
    (this->m_texture).m_state = pSVar2;
    if (pSVar2 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((this->m_texture).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
  }
  pTVar3 = (this->m_texture).m_ptr;
  pSVar2 = (pTVar3->sourceImage).m_state;
  if (pSVar2 != (this->m_image).m_state) {
    if (pSVar2 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar2->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (pTVar3->sourceImage).m_ptr = (EGLImage *)0x0;
        (*((pTVar3->sourceImage).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((pTVar3->sourceImage).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar2 = (pTVar3->sourceImage).m_state;
        if (pSVar2 != (SharedPtrStateBase *)0x0) {
          (*pSVar2->_vptr_SharedPtrStateBase[1])();
        }
        (pTVar3->sourceImage).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (pTVar3->sourceImage).m_ptr = (this->m_image).m_ptr;
    pSVar2 = (this->m_image).m_state;
    (pTVar3->sourceImage).m_state = pSVar2;
    if (pSVar2 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((pTVar3->sourceImage).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
  }
  return;
}

Assistant:

CreateImageFromTexture::CreateImageFromTexture (SharedPtr<EGLImage>& image, SharedPtr<Texture> texture, bool useSync, bool serverSync)
	: Operation	("CreateImageFromTexture", useSync, serverSync)
{
	modifyGLObject(SharedPtr<Object>(texture));
	image = SharedPtr<EGLImage>(new EGLImage(getEvent(), getSync()));

	m_image					= image;
	m_texture				= texture;
	m_texture->sourceImage	= m_image;
}